

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

_Bool SaveFileText(char *fileName,char *text)

{
  int iVar1;
  FILE *__stream;
  int result;
  int count;
  FILE *file;
  _Bool success;
  char *text_local;
  char *fileName_local;
  
  fileName_local._7_1_ = false;
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
  }
  else if (saveFileText == (SaveFileTextCallback)0x0) {
    __stream = fopen(fileName,"wt");
    if (__stream == (FILE *)0x0) {
      TraceLog(4,"FILEIO: [%s] Failed to open text file",fileName);
    }
    else {
      iVar1 = fprintf(__stream,"%s",text);
      if (iVar1 < 0) {
        TraceLog(4,"FILEIO: [%s] Failed to write text file",fileName);
      }
      else {
        TraceLog(3,"FILEIO: [%s] Text file saved successfully",fileName);
      }
      iVar1 = fclose(__stream);
      fileName_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    fileName_local._7_1_ = (*saveFileText)(fileName,text);
  }
  return fileName_local._7_1_;
}

Assistant:

bool SaveFileText(const char *fileName, char *text)
{
    bool success = false;

    if (fileName != NULL)
    {
        if (saveFileText)
        {
            return saveFileText(fileName, text);
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "wt");

        if (file != NULL)
        {
            int count = fprintf(file, "%s", text);

            if (count < 0) TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to write text file", fileName);
            else TRACELOG(LOG_INFO, "FILEIO: [%s] Text file saved successfully", fileName);

            int result = fclose(file);
            if (result == 0) success = true;
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open text file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return success;
}